

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_set_cpsr(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,uint32_t mask)

{
  TCGv_i32 arg3;
  TCGv_i32 tmp_mask;
  uint32_t mask_local;
  TCGv_i32 var_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  arg3 = tcg_const_i32_aarch64(tcg_ctx,mask);
  gen_helper_cpsr_write_aarch64(tcg_ctx,tcg_ctx->cpu_env,var,arg3);
  tcg_temp_free_i32(tcg_ctx,arg3);
  return;
}

Assistant:

static inline void gen_set_cpsr(TCGContext *tcg_ctx, TCGv_i32 var, uint32_t mask)
{
    TCGv_i32 tmp_mask = tcg_const_i32(tcg_ctx, mask);
    gen_helper_cpsr_write(tcg_ctx, tcg_ctx->cpu_env, var, tmp_mask);
    tcg_temp_free_i32(tcg_ctx, tmp_mask);
}